

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_unsub_and_sub_multiple_instruments_controls_are_in_correct_order_Test
::
~SubjectSetRegisterTest_next_subscription_sync_after_unsub_and_sub_multiple_instruments_controls_are_in_correct_order_Test
          (SubjectSetRegisterTest_next_subscription_sync_after_unsub_and_sub_multiple_instruments_controls_are_in_correct_order_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_unsub_and_sub_multiple_instruments_controls_are_in_correct_order)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.Register(SS_RFS_SUBJECT1, false);
    std::vector<Subject> subjects_set = {SS_SUBJECT0, SS_RFS_SUBJECT1, SS_SUBJECT2, SS_SUBJECT3};
    std::optional<SubscriptionSync> message1 = subject_register.NextSubscriptionSync();
    EXPECT_EQ(subjects_set, message1->GetSubjects());

    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_RFS_SUBJECT1);
    subject_register.Unregister(SS_SUBJECT2);
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_RFS_SUBJECT1, true);
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);

    std::optional<SubscriptionSync> message2 = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message2->IsChangedEdition());
    std::map<uint32_t, ControlOperationEnum> control_set = {{1, ControlOperationEnum ::REFRESH}, {3, ControlOperationEnum::TOGGLE}};
    EXPECT_EQ(control_set, message2->GetControls());
}